

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

double __thiscall pugi::xpath_query::evaluate_number(xpath_query *this,xpath_node *n)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  xpath_context c;
  xpath_stack_data sd;
  xpath_context local_2098;
  xpath_memory_block local_2070;
  xpath_memory_block local_1060;
  xpath_allocator local_50;
  xpath_allocator local_38;
  xpath_stack local_20;
  bool local_10 [8];
  
  if ((undefined8 *)this->_impl != (undefined8 *)0x0) {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_20.result = &local_50;
    local_50._error = local_10;
    local_50._root = &local_2070;
    local_50._root_size = 0;
    local_20.temp = &local_38;
    local_38._root = &local_1060;
    local_38._root_size = 0;
    local_10[0] = false;
    local_1060.next = (xpath_memory_block *)0x0;
    local_2070.next = (xpath_memory_block *)0x0;
    local_1060.capacity = 0x1000;
    local_2070.capacity = 0x1000;
    local_38._error = local_50._error;
    dVar1 = impl::anon_unknown_0::xpath_ast_node::eval_number(*this->_impl,&local_2098,&local_20);
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (local_10[0] != false) {
      uVar2 = 0;
      uVar3 = 0x7ff80000;
    }
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_50._root);
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_38._root);
    return (double)CONCAT44(uVar3,uVar2);
  }
  return NAN;
}

Assistant:

PUGI_IMPL_FN double xpath_query::evaluate_number(const xpath_node& n) const
	{
		if (!_impl) return impl::gen_nan();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		double r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_number(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return impl::gen_nan();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}